

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPersistentManifold.cpp
# Opt level: O2

int __thiscall
btPersistentManifold::addManifoldPoint
          (btPersistentManifold *this,btManifoldPoint *newPoint,bool isPredictive)

{
  uint uVar1;
  btPersistentManifold *this_00;
  ulong uVar2;
  
  uVar1 = this->m_cachedPoints;
  if (uVar1 == 4) {
    this_00 = this;
    uVar1 = sortCachedPoints(this,newPoint);
    clearUserCache(this_00,this->m_pointCache + (int)uVar1);
  }
  else {
    this->m_cachedPoints = uVar1 + 1;
  }
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  memcpy(this->m_pointCache + uVar2,newPoint,0xbc);
  return (int)uVar2;
}

Assistant:

int btPersistentManifold::addManifoldPoint(const btManifoldPoint& newPoint, bool isPredictive)
{
	if (!isPredictive)
	{
		btAssert(validContactDistance(newPoint));
	}
	
	int insertIndex = getNumContacts();
	if (insertIndex == MANIFOLD_CACHE_SIZE)
	{
#if MANIFOLD_CACHE_SIZE >= 4
		//sort cache so best points come first, based on area
		insertIndex = sortCachedPoints(newPoint);
#else
		insertIndex = 0;
#endif
		clearUserCache(m_pointCache[insertIndex]);
		
	} else
	{
		m_cachedPoints++;

		
	}
	if (insertIndex<0)
		insertIndex=0;

	btAssert(m_pointCache[insertIndex].m_userPersistentData==0);
	m_pointCache[insertIndex] = newPoint;
	return insertIndex;
}